

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.h
# Opt level: O0

void __thiscall
HighsSparseMatrix::HighsSparseMatrix(HighsSparseMatrix *this,HighsSparseMatrix *param_2)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RSI + 1);
  *in_RDI = *in_RSI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000010,
             (vector<int,_std::allocator<int>_> *)in_stack_00000008);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000010,
             (vector<int,_std::allocator<int>_> *)in_stack_00000008);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000010,
             (vector<int,_std::allocator<int>_> *)in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::vector(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

HighsSparseMatrix() { clear(); }